

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_converter_process_pcm_frames__channels_only
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_format formatOut;
  ma_result mVar1;
  ulong uVar2;
  ulong frameCount;
  undefined1 *pFramesOut_00;
  undefined1 *pIn;
  ulong uVar3;
  byte bVar4;
  undefined1 *pOut;
  ulong uVar5;
  ulong uVar6;
  ma_uint8 pTempBufferIn [4096];
  ma_uint8 pTempBufferOut [4096];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  if (pFrameCountIn == (ma_uint64 *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *pFrameCountIn;
  }
  if (pFrameCountOut == (ma_uint64 *)0x0) {
    frameCount = 0;
  }
  else {
    frameCount = *pFrameCountOut;
  }
  if (uVar3 < frameCount) {
    frameCount = uVar3;
  }
  if ((pConverter->field_0x2768 & 3) == 0) {
    mVar1 = ma_channel_converter_process_pcm_frames
                      (&pConverter->channelConverter,pFramesOut,pFramesIn,frameCount);
    if (mVar1 != 0) {
      return mVar1;
    }
  }
  else if (frameCount != 0) {
    uVar3 = 0;
    do {
      formatOut = (pConverter->channelConverter).format;
      uVar5 = 0x1000 / (ulong)((pConverter->channelConverter).channelsOut *
                              (&DAT_001158a0)[formatOut]);
      if (pFramesIn == (void *)0x0) {
        pIn = (undefined1 *)0x0;
      }
      else {
        pIn = (undefined1 *)
              (((&DAT_001158a0)[(pConverter->config).formatIn] * (pConverter->config).channelsIn) *
               uVar3 + (long)pFramesIn);
      }
      if (pFramesOut == (void *)0x0) {
        pOut = (undefined1 *)0x0;
      }
      else {
        pOut = (undefined1 *)
               (((&DAT_001158a0)[(pConverter->config).formatOut] * (pConverter->config).channelsOut)
                * uVar3 + (long)pFramesOut);
      }
      bVar4 = pConverter->field_0x2768;
      if ((bVar4 & 1) == 0) {
        if ((bVar4 & 2) == 0) {
          __assert_fail("pConverter->hasPostFormatConversion == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                        ,0x87f8,
                        "ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        uVar6 = frameCount - uVar3;
        if (uVar5 <= frameCount - uVar3) {
          uVar6 = uVar5;
        }
        pFramesOut_00 = local_1038;
      }
      else {
        uVar6 = 0x1000 / (ulong)((&DAT_001158a0)[formatOut] *
                                (pConverter->channelConverter).channelsIn);
        uVar2 = frameCount - uVar3;
        if (uVar6 <= frameCount - uVar3) {
          uVar2 = uVar6;
        }
        if (uVar2 < uVar5) {
          uVar5 = uVar2;
        }
        uVar6 = uVar5;
        if ((bVar4 & 2) == 0) {
          uVar6 = uVar2;
        }
        if (pIn == (undefined1 *)0x0) {
          memset(local_2038,0,0x1000);
        }
        else {
          ma_convert_pcm_frames_format
                    (local_2038,formatOut,pIn,(pConverter->config).formatIn,uVar6,
                     (pConverter->config).channelsIn,(pConverter->config).ditherMode);
          bVar4 = pConverter->field_0x2768;
        }
        pFramesOut_00 = pOut;
        if ((bVar4 & 2) != 0) {
          pFramesOut_00 = local_1038;
        }
        pIn = local_2038;
      }
      mVar1 = ma_channel_converter_process_pcm_frames
                        (&pConverter->channelConverter,pFramesOut_00,pIn,uVar6);
      if (mVar1 != 0) break;
      if (((pConverter->field_0x2768 & 2) != 0) && (pOut != (undefined1 *)0x0)) {
        ma_convert_pcm_frames_format
                  (pOut,(pConverter->config).formatOut,local_1038,
                   (pConverter->channelConverter).format,uVar6,
                   (pConverter->channelConverter).channelsOut,(pConverter->config).ditherMode);
      }
      uVar3 = uVar3 + uVar6;
    } while (uVar3 < frameCount);
  }
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = frameCount;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = frameCount;
  }
  return 0;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_result result;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 frameCount;

    MA_ASSERT(pConverter != NULL);

    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    frameCount = ma_min(frameCountIn, frameCountOut);

    if (pConverter->hasPreFormatConversion == MA_FALSE && pConverter->hasPostFormatConversion == MA_FALSE) {
        /* No format conversion required. */
        result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOut, pFramesIn, frameCount);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        /* Format conversion required. */
        ma_uint64 framesProcessed = 0;

        while (framesProcessed < frameCount) {
            ma_uint8 pTempBufferOut[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
            const ma_uint32 tempBufferOutCap = sizeof(pTempBufferOut) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsOut);
            const void* pFramesInThisIteration;
            /* */ void* pFramesOutThisIteration;
            ma_uint64 frameCountThisIteration;

            if (pFramesIn != NULL) {
                pFramesInThisIteration = ma_offset_ptr(pFramesIn, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatIn, pConverter->config.channelsIn));
            } else {
                pFramesInThisIteration = NULL;
            }

            if (pFramesOut != NULL) {
                pFramesOutThisIteration = ma_offset_ptr(pFramesOut, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
            } else {
                pFramesOutThisIteration = NULL;
            }

            /* Do a pre format conversion if necessary. */
            if (pConverter->hasPreFormatConversion) {
                ma_uint8 pTempBufferIn[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                const ma_uint32 tempBufferInCap = sizeof(pTempBufferIn) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsIn);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferInCap) {
                    frameCountThisIteration = tempBufferInCap;
                }

                if (pConverter->hasPostFormatConversion) {
                    if (frameCountThisIteration > tempBufferOutCap) {
                        frameCountThisIteration = tempBufferOutCap;
                    }
                }

                if (pFramesInThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pTempBufferIn, pConverter->channelConverter.format, pFramesInThisIteration, pConverter->config.formatIn, frameCountThisIteration, pConverter->config.channelsIn, pConverter->config.ditherMode);
                } else {
                    MA_ZERO_MEMORY(pTempBufferIn, sizeof(pTempBufferIn));
                }

                if (pConverter->hasPostFormatConversion) {
                    /* Both input and output conversion required. Output to the temp buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pTempBufferIn, frameCountThisIteration);
                } else {
                    /* Only pre-format required. Output straight to the output buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOutThisIteration, pTempBufferIn, frameCountThisIteration);
                }

                if (result != MA_SUCCESS) {
                    break;
                }
            } else {
                /* No pre-format required. Just read straight from the input buffer. */
                MA_ASSERT(pConverter->hasPostFormatConversion == MA_TRUE);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferOutCap) {
                    frameCountThisIteration = tempBufferOutCap;
                }

                result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pFramesInThisIteration, frameCountThisIteration);
                if (result != MA_SUCCESS) {
                    break;
                }
            }

            /* If we are doing a post format conversion we need to do that now. */
            if (pConverter->hasPostFormatConversion) {
                if (pFramesOutThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pFramesOutThisIteration, pConverter->config.formatOut, pTempBufferOut, pConverter->channelConverter.format, frameCountThisIteration, pConverter->channelConverter.channelsOut, pConverter->config.ditherMode);
                }
            }

            framesProcessed += frameCountThisIteration;
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = frameCount;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = frameCount;
    }

    return MA_SUCCESS;
}